

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

void __thiscall Patch::rebalance(Patch *this)

{
  uint32_t uVar1;
  Node *pivot;
  Node *root;
  ulong uVar2;
  Node *root_parent;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  
  root = this->root;
  if (root != (Node *)0x0) {
    root_parent = (Node *)0x0;
    do {
      pivot = root->left;
      if (pivot == (Node *)0x0) {
        root_parent = root;
        root = root->right;
      }
      else {
        rotate_node_right(this,pivot,root,root_parent);
        root = pivot;
      }
    } while (root != (Node *)0x0);
    uVar1 = this->change_count;
    dVar5 = log2((double)(uVar1 + 1));
    dVar5 = floor(dVar5);
    dVar5 = exp2(dVar5);
    uVar4 = (ulong)(dVar5 + -1.0);
    perform_rebalancing_rotations(this,uVar1 - (uint)uVar4);
    if (1 < (uint)uVar4) {
      uVar2 = uVar4 & 0xffffffff;
      do {
        uVar2 = uVar2 >> 1;
        perform_rebalancing_rotations(this,(uint32_t)uVar2);
        uVar3 = (uint)uVar4;
        uVar4 = uVar2;
      } while (3 < uVar3);
    }
  }
  return;
}

Assistant:

void Patch::rebalance() {
  if (!root)
    return;

  // Transform tree to vine
  Node *pseudo_root = root, *pseudo_root_parent = nullptr;
  while (pseudo_root) {
    Node *left = pseudo_root->left;
    Node *right = pseudo_root->right;
    if (left) {
      rotate_node_right(left, pseudo_root, pseudo_root_parent);
      pseudo_root = left;
    } else {
      pseudo_root_parent = pseudo_root;
      pseudo_root = right;
    }
  }

  // Transform vine to balanced tree
  uint32_t n = change_count;
  uint32_t m = std::pow(2, std::floor(std::log2(n + 1))) - 1;
  perform_rebalancing_rotations(n - m);
  while (m > 1) {
    m = m / 2;
    perform_rebalancing_rotations(m);
  }
}